

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

int deqp::gles31::Functional::anon_unknown_0::getLastFullLevel(ImageInfo *info)

{
  deUint32 dVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int i;
  long lVar7;
  IVec3 IVar8;
  IVec3 levelSize;
  IVec3 blockPixelSize;
  int local_40 [3];
  int local_34;
  int local_30;
  int local_2c;
  
  iVar4 = getLevelCount(info);
  IVar8 = getTexelBlockPixelSize((anon_unknown_0 *)&local_34,info->m_format);
  bVar3 = 0 < iVar4;
  iVar6 = IVar8.m_data[2];
  if (0 < iVar4) {
    dVar1 = info->m_target;
    iVar2 = (info->m_size).m_data[2];
    iVar5 = 0;
    do {
      local_40[2] = 0;
      local_40[0] = 0;
      local_40[1] = 0;
      lVar7 = 0;
      if (dVar1 == 0x8c1a) {
        do {
          iVar6 = (info->m_size).m_data[lVar7] >> ((byte)iVar5 & 0x1f);
          if (iVar6 < 2) {
            iVar6 = 1;
          }
          local_40[lVar7] = iVar6;
          lVar7 = lVar7 + 1;
          local_40[2] = iVar2;
        } while (lVar7 == 1);
      }
      else {
        do {
          iVar6 = (info->m_size).m_data[lVar7] >> ((byte)iVar5 & 0x1f);
          if (iVar6 < 2) {
            iVar6 = 1;
          }
          local_40[lVar7] = iVar6;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
      }
      iVar6 = iVar5 + -1;
      if ((local_40[1] < local_30 || local_40[0] < local_34) || local_40[2] < local_2c) break;
      iVar5 = iVar5 + 1;
      bVar3 = iVar5 < iVar4;
      iVar6 = IVar8.m_data[2];
    } while (iVar5 != iVar4);
  }
  iVar4 = iVar4 + -1;
  if (bVar3) {
    iVar4 = iVar6;
  }
  return iVar4;
}

Assistant:

int getLastFullLevel (const ImageInfo& info)
{
	const int	levelCount		= getLevelCount(info);
	const IVec3	blockPixelSize	= getTexelBlockPixelSize(info.getFormat());

	for (int level = 0; level < levelCount; level++)
	{
		const IVec3 levelSize = getLevelSize(info.getTarget(), info.getSize(), level);

		if (levelSize.x() < blockPixelSize.x() || levelSize.y() < blockPixelSize.y() || levelSize.z() < blockPixelSize.z())
			return level - 1;
	}

	return levelCount -1;
}